

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

upb_Message_DeleteUnknownStatus
upb_Message_DeleteUnknown(upb_Message *msg,upb_StringView *data,uintptr_t *iter,upb_Arena *arena)

{
  upb_TaggedAuxPtr uVar1;
  char *pcVar2;
  char *pcVar3;
  _Bool _Var4;
  upb_StringView *puVar5;
  long *plVar6;
  uintptr_t uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  upb_Message_DeleteUnknownStatus uVar11;
  uint *puVar12;
  ulong uVar13;
  
  puVar12 = (uint *)(msg->field_0).internal_opaque;
  if (((ulong)puVar12 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb0,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  uVar13 = *iter;
  if (uVar13 == 0) {
    __assert_fail("*iter != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb1,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (puVar12 == (uint *)0x0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb3,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (*puVar12 < uVar13) {
    __assert_fail("*iter <= in->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb4,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  uVar1.ptr = *(uintptr_t *)(puVar12 + uVar13 * 2);
  if ((uVar1.ptr == 0) || ((uVar1.ptr & 1) != 0)) {
    __assert_fail("upb_TaggedAuxPtr_IsUnknown(unknown_ptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb6,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  puVar5 = upb_TaggedAuxPtr_UnknownData(uVar1);
  pcVar2 = puVar5->data;
  sVar8 = puVar5->size;
  pcVar3 = data->data;
  if (pcVar2 == pcVar3) {
    sVar8 = sVar8 - data->size;
    if (sVar8 != 0) {
      puVar5->data = pcVar2 + data->size;
      puVar5->size = sVar8;
      sVar8 = puVar5->size;
      data->data = puVar5->data;
      data->size = sVar8;
      return kUpb_DeleteUnknown_IterUpdated;
    }
    uVar7 = *iter;
    (puVar12 + uVar7 * 2)[0] = 0;
    (puVar12 + uVar7 * 2)[1] = 0;
  }
  else if (pcVar2 + sVar8 == pcVar3 + data->size) {
    puVar5->size = sVar8 - data->size;
    if ((uVar1.ptr & 2) == 0) {
      *(ulong *)(puVar12 + *iter * 2) = (ulong)puVar5 | 2;
    }
  }
  else {
    if ((pcVar3 <= pcVar2) || (pcVar2 + sVar8 <= pcVar3 + data->size)) {
      __assert_fail("unknown->data < data->data && unknown->data + unknown->size > data->data + data->size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                    ,0xca,
                    "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                   );
    }
    plVar6 = (long *)upb_Arena_Malloc(arena,0x10);
    if (plVar6 == (long *)0x0) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    _Var4 = _upb_Message_ReserveSlot_dont_copy_me__upb_internal_use_only(msg,arena);
    if (!_Var4) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    puVar12 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
    uVar7 = *iter;
    if (*puVar12 - uVar7 != 0) {
      memmove(puVar12 + uVar7 * 2 + 4,puVar12 + uVar7 * 2 + 2,(*puVar12 - uVar7) * 8);
      uVar7 = *iter;
    }
    *(ulong *)(puVar12 + uVar7 * 2 + 2) = (ulong)plVar6 | 2;
    if ((uVar1.ptr & 2) == 0) {
      *(ulong *)(puVar12 + *iter * 2) = (ulong)puVar5 | 2;
    }
    *puVar12 = *puVar12 + 1;
    pcVar2 = data->data;
    sVar8 = data->size;
    *plVar6 = (long)(pcVar2 + sVar8);
    pcVar3 = puVar5->data;
    plVar6[1] = (long)(pcVar3 + (puVar5->size - (long)(pcVar2 + sVar8)));
    puVar5->size = (long)data->data - (long)pcVar3;
  }
  uVar13 = *iter;
  puVar12 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
  uVar10 = uVar13;
  if (puVar12 == (uint *)0x0) {
LAB_0024ee20:
    data->data = (char *)0x0;
    data->size = 0;
    uVar11 = kUpb_DeleteUnknown_DeletedLast;
  }
  else {
    uVar9 = (ulong)*puVar12;
    uVar10 = uVar9;
    if (uVar9 < uVar13) {
      uVar10 = uVar13;
    }
    do {
      if (uVar9 <= uVar13) goto LAB_0024ee20;
      uVar1.ptr = *(uintptr_t *)(puVar12 + uVar13 * 2 + 2);
      uVar13 = uVar13 + 1;
    } while ((uVar1.ptr & 1) != 0 || uVar1.ptr == 0);
    puVar5 = upb_TaggedAuxPtr_UnknownData(uVar1);
    sVar8 = puVar5->size;
    data->data = puVar5->data;
    data->size = sVar8;
    uVar11 = kUpb_DeleteUnknown_IterUpdated;
    uVar10 = uVar13;
  }
  *iter = uVar10;
  return uVar11;
}

Assistant:

upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message* msg,
                                                          upb_StringView* data,
                                                          uintptr_t* iter,
                                                          upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  UPB_ASSERT(*iter != kUpb_Message_UnknownBegin);
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  UPB_ASSERT(in);
  UPB_ASSERT(*iter <= in->size);
  upb_TaggedAuxPtr unknown_ptr = in->aux_data[*iter - 1];
  UPB_ASSERT(upb_TaggedAuxPtr_IsUnknown(unknown_ptr));
  upb_StringView* unknown = upb_TaggedAuxPtr_UnknownData(unknown_ptr);
  if (unknown->data == data->data && unknown->size == data->size) {
    // Remove whole field
    in->aux_data[*iter - 1] = upb_TaggedAuxPtr_Null();
  } else if (unknown->data == data->data) {
    // Strip prefix
    unknown->data += data->size;
    unknown->size -= data->size;
    *data = *unknown;
    return kUpb_DeleteUnknown_IterUpdated;
  } else if (unknown->data + unknown->size == data->data + data->size) {
    // Truncate existing field
    unknown->size -= data->size;
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] =
          upb_TaggedAuxPtr_MakeUnknownDataAliased(unknown);
    }
  } else {
    UPB_ASSERT(unknown->data < data->data &&
               unknown->data + unknown->size > data->data + data->size);
    // Split in the middle
    upb_StringView* prefix = unknown;
    upb_StringView* suffix = upb_Arena_Malloc(arena, sizeof(upb_StringView));
    if (!suffix) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    if (!UPB_PRIVATE(_upb_Message_ReserveSlot)(msg, arena)) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
    if (*iter != in->size) {
      // Shift later entries down so that unknown field ordering is preserved
      memmove(&in->aux_data[*iter + 1], &in->aux_data[*iter],
              sizeof(upb_TaggedAuxPtr) * (in->size - *iter));
    }
    in->aux_data[*iter] = upb_TaggedAuxPtr_MakeUnknownDataAliased(suffix);
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] = upb_TaggedAuxPtr_MakeUnknownDataAliased(prefix);
    }
    in->size++;
    suffix->data = data->data + data->size;
    suffix->size = (prefix->data + prefix->size) - suffix->data;
    prefix->size = data->data - prefix->data;
  }
  return upb_Message_NextUnknown(msg, data, iter)
             ? kUpb_DeleteUnknown_IterUpdated
             : kUpb_DeleteUnknown_DeletedLast;
}